

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_afk(CHAR_DATA *ch,char *argument)

{
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var1;
  char buf [4608];
  char *in_stack_ffffffffffffedd8;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  
  ch_00 = *(CHAR_DATA **)(in_RDI + 400);
  _Var1 = std::pow<int,int>(0,0x59b6fa);
  if (((ulong)ch_00 & (long)_Var1) == 0) {
    _Var1 = std::pow<int,int>(0,0x59b799);
    *(ulong *)(in_RDI + 400) = (long)_Var1 | *(ulong *)(in_RDI + 400);
    send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
    if (*in_RSI == '\0') {
      sprintf(&stack0xffffffffffffede8,"$N is now AFK.");
    }
    else {
      sprintf(&stack0xffffffffffffede8,"$N is now AFK (%s).",in_RSI);
    }
    wiznet((char *)buf._64_8_,(CHAR_DATA *)buf._56_8_,(OBJ_DATA *)buf._48_8_,buf._40_8_,buf._32_8_,
           buf._28_4_);
  }
  else {
    _Var1 = std::pow<int,int>(0,0x59b71c);
    *(ulong *)(in_RDI + 400) = ((long)_Var1 ^ 0xffffffffffffffffU) & *(ulong *)(in_RDI + 400);
    send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
    wiznet((char *)buf._64_8_,(CHAR_DATA *)buf._56_8_,(OBJ_DATA *)buf._48_8_,buf._40_8_,buf._32_8_,
           buf._28_4_);
    do_replay(ch_00,in_stack_ffffffffffffedd8);
  }
  return;
}

Assistant:

void do_afk(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];

	if (IS_SET(ch->comm, COMM_AFK))
	{
		REMOVE_BIT(ch->comm, COMM_AFK);

		send_to_char("AFK removed.\n\r", ch);
		wiznet("$N is no longer AFK.", ch, nullptr, 0, 0, 0);

		do_replay(ch, "");
	}
	else
	{
		SET_BIT(ch->comm, COMM_AFK);

		send_to_char("AFK set.\n\r", ch);

		if (argument[0] != '\0')
			sprintf(buf, "$N is now AFK (%s).", argument);
		else
			sprintf(buf, "$N is now AFK.");

		wiznet(buf, ch, nullptr, 0, 0, 0);
	}
}